

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O0

void __thiscall QTextTable::removeRows(QTextTable *this,int pos,int num)

{
  bool bVar1;
  uint uVar2;
  FormatChangeMode mode;
  int iVar3;
  QTextTablePrivate *pQVar4;
  reference pvVar5;
  FragmentMap *p_00;
  qsizetype qVar6;
  long lVar7;
  uint *puVar8;
  int in_EDX;
  int in_ESI;
  QTextDocumentPrivate *in_RDI;
  long in_FS_OFFSET;
  int f_end;
  int index;
  int span;
  int c;
  int r;
  int pos_1;
  QTextFormatCollection *collection;
  QTextDocumentPrivate *p;
  QTextTablePrivate *d;
  int cell;
  QList<int> touchedCells;
  QTextCharFormat fmt;
  FragmentIterator it;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  QTextDocumentPrivate *in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  QTextTable *in_stack_ffffffffffffff18;
  QTextCharFormat *in_stack_ffffffffffffff40;
  QTextDocumentPrivate *this_00;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar9;
  int local_98;
  int local_78;
  undefined1 local_38 [16];
  QTextTableCell local_28;
  QTextTableCell local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QTextTable *)0x897634);
  if ((0 < in_EDX) && (-1 < in_ESI)) {
    if ((pQVar4->dirty & 1U) != 0) {
      QTextTablePrivate::update
                ((QTextTablePrivate *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60))
      ;
    }
    if (in_ESI < pQVar4->nRows) {
      local_78 = in_EDX;
      if (pQVar4->nRows < in_ESI + in_EDX) {
        local_78 = pQVar4->nRows - in_ESI;
      }
      this_00 = (pQVar4->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
      QTextDocumentPrivate::formatCollection(this_00);
      QTextDocumentPrivate::beginEditBlock(this_00);
      if ((in_ESI == 0) && (local_78 == pQVar4->nRows)) {
        QTextDocumentPrivate::fragmentMap(this_00);
        uVar2 = QFragmentMap<QTextFragmentData>::position
                          ((QFragmentMap<QTextFragmentData> *)
                           CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                           in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
        QTextDocumentPrivate::fragmentMap(this_00);
        QFragmentMap<QTextFragmentData>::position
                  ((QFragmentMap<QTextFragmentData> *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                   in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
        QTextDocumentPrivate::remove(this_00,(char *)(ulong)uVar2);
        QTextDocumentPrivate::endEditBlock
                  ((QTextDocumentPrivate *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      else {
        cellAt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
        mode = QTextTableCell::firstPosition
                         ((QTextTableCell *)
                          CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        cellAt(in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,in_stack_ffffffffffffff10);
        QTextTableCell::lastPosition
                  ((QTextTableCell *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        QTextDocumentPrivate::aboutToRemoveCell
                  (in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
        QTextTableCell::~QTextTableCell(&local_28);
        QTextTableCell::~QTextTableCell(&local_18);
        QList<int>::QList((QList<int> *)0x897894);
        for (local_98 = in_ESI; local_98 < in_ESI + local_78; local_98 = local_98 + 1) {
          for (iVar9 = 0; iVar9 < pQVar4->nCols; iVar9 = iVar9 + 1) {
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                (size_type)in_stack_ffffffffffffff08);
            iVar3 = *pvVar5;
            bVar1 = QListSpecialMethodsBase<int>::contains<int>
                              ((QListSpecialMethodsBase<int> *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               (int *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))
            ;
            if (!bVar1) {
              QList<int>::operator<<
                        ((QList<int> *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)
                         ,in_stack_fffffffffffffefc);
              local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
              p_00 = QTextDocumentPrivate::fragmentMap(this_00);
              QFragmentMap<QTextFragmentData>::ConstIterator::ConstIterator
                        ((ConstIterator *)local_38,p_00,iVar3);
              QFragmentMap<QTextFragmentData>::ConstIterator::operator->((ConstIterator *)0x8979bb);
              QTextFormatCollection::charFormat
                        ((QTextFormatCollection *)
                         CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
              iVar3 = QTextCharFormat::tableCellRowSpan
                                ((QTextCharFormat *)
                                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
              if (iVar3 < 2) {
                qVar6 = QListSpecialMethodsBase<int>::indexOf<int>
                                  ((QListSpecialMethodsBase<int> *)
                                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                   (int *)CONCAT44(in_stack_fffffffffffffefc,
                                                   in_stack_fffffffffffffef8),0x897a58);
                lVar7 = (long)((int)qVar6 + 1);
                qVar6 = QList<int>::size(&pQVar4->cells);
                if (lVar7 < qVar6) {
                  puVar8 = (uint *)QList<int>::at((QList<int> *)
                                                  CONCAT44(in_stack_ffffffffffffff04,
                                                           in_stack_ffffffffffffff00),
                                                  CONCAT44(in_stack_fffffffffffffefc,
                                                           in_stack_fffffffffffffef8));
                  in_stack_ffffffffffffff14 = *puVar8;
                }
                else {
                  in_stack_ffffffffffffff14 = (pQVar4->super_QTextFramePrivate).fragment_end;
                }
                in_stack_ffffffffffffff08 = this_00;
                in_stack_ffffffffffffff10 =
                     QFragmentMap<QTextFragmentData>::ConstIterator::position
                               ((ConstIterator *)0x897ae0);
                QTextDocumentPrivate::fragmentMap(this_00);
                in_stack_ffffffffffffff04 =
                     QFragmentMap<QTextFragmentData>::position
                               ((QFragmentMap<QTextFragmentData> *)
                                CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
                QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)0x897b10);
                QTextDocumentPrivate::remove
                          (in_stack_ffffffffffffff08,(char *)(ulong)in_stack_ffffffffffffff10);
              }
              else {
                QTextCharFormat::setTableCellRowSpan
                          ((QTextCharFormat *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
                QFragmentMap<QTextFragmentData>::ConstIterator::position((ConstIterator *)0x897a16);
                QTextDocumentPrivate::setCharFormat
                          (in_RDI,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,
                           in_stack_ffffffffffffff40,mode);
              }
              QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x897b36);
            }
          }
        }
        QTextDocumentPrivate::endEditBlock
                  ((QTextDocumentPrivate *)
                   CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        QList<int>::~QList((QList<int> *)0x897b72);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextTable::removeRows(int pos, int num)
{
    Q_D(QTextTable);
//     qDebug() << "-------- removeRows" << pos << num;

    if (num <= 0 || pos < 0)
        return;
    if (d->dirty)
        d->update();
    if (pos >= d->nRows)
        return;
    if (pos+num > d->nRows)
        num = d->nRows - pos;

    QTextDocumentPrivate *p = d->pieceTable;
    QTextFormatCollection *collection = p->formatCollection();
    p->beginEditBlock();

    // delete whole table?
    if (pos == 0 && num == d->nRows) {
        const int pos = p->fragmentMap().position(d->fragment_start);
        p->remove(pos, p->fragmentMap().position(d->fragment_end) - pos + 1);
        p->endEditBlock();
        return;
    }

    p->aboutToRemoveCell(cellAt(pos, 0).firstPosition(), cellAt(pos + num - 1, d->nCols - 1).lastPosition());

    QList<int> touchedCells;
    for (int r = pos; r < pos + num; ++r) {
        for (int c = 0; c < d->nCols; ++c) {
            int cell = d->grid[r*d->nCols + c];
            if (touchedCells.contains(cell))
                continue;
            touchedCells << cell;
            QTextDocumentPrivate::FragmentIterator it(&p->fragmentMap(), cell);
            QTextCharFormat fmt = collection->charFormat(it->format);
            int span = fmt.tableCellRowSpan();
            if (span > 1) {
                fmt.setTableCellRowSpan(span - 1);
                p->setCharFormat(it.position(), 1, fmt);
            } else {
                // remove cell
                int index = d->cells.indexOf(cell) + 1;
                int f_end = index < d->cells.size() ? d->cells.at(index) : d->fragment_end;
                p->remove(it.position(), p->fragmentMap().position(f_end) - it.position());
            }
        }
    }

    p->endEditBlock();
//     qDebug() << "-------- end removeRows" << pos << num;
}